

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::FillForwardDeclarations
          (FileGenerator *this,ForwardDeclarations *decls)

{
  pointer pbVar1;
  pointer ppEVar2;
  pointer ppMVar3;
  FileDescriptor *file;
  int index;
  int i;
  ulong uVar4;
  int i_2;
  long lVar5;
  FileGenerator dependency;
  FileGenerator local_230;
  
  for (index = 0; index < *(int *)(this->file_ + 0x38); index = index + 1) {
    file = FileDescriptor::public_dependency(this->file_,index);
    FileGenerator(&local_230,file,&this->options_);
    FillForwardDeclarations(&local_230,decls);
    ~FileGenerator(&local_230);
  }
  lVar5 = 0;
  for (uVar4 = 0;
      pbVar1 = (this->package_parts_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->package_parts_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar4 = uVar4 + 1) {
    decls = ForwardDeclarations::AddOrGetNamespace
                      (decls,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar5));
    lVar5 = lVar5 + 0x20;
  }
  for (uVar4 = 0;
      ppEVar2 = (this->enum_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->enum_generators_).
                            super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3);
      uVar4 = uVar4 + 1) {
    EnumGenerator::FillForwardDeclaration(ppEVar2[uVar4],&decls->enums_);
  }
  for (uVar4 = 0;
      ppMVar3 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->message_generators_).
                            super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar3 >> 3);
      uVar4 = uVar4 + 1) {
    MessageGenerator::FillMessageForwardDeclarations(ppMVar3[uVar4],&decls->classes_);
  }
  return;
}

Assistant:

void FileGenerator::FillForwardDeclarations(ForwardDeclarations* decls) {
  for (int i = 0; i < file_->public_dependency_count(); i++) {
    FileGenerator dependency(file_->public_dependency(i), options_);
    dependency.FillForwardDeclarations(decls);
  }
  for (int i = 0; i < package_parts_.size(); i++) {
    decls = decls->AddOrGetNamespace(package_parts_[i]);
  }
  // Generate enum definitions.
  for (int i = 0; i < enum_generators_.size(); i++) {
    enum_generators_[i]->FillForwardDeclaration(&decls->enums());
  }
  // Generate forward declarations of classes.
  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->FillMessageForwardDeclarations(
        &decls->classes());
  }
}